

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchDiv.c
# Opt level: O0

int Fxch_DivRemove(Fxch_Man_t *pFxchMan,int fUpdate,int fSingleCube,int fBase)

{
  Vec_Flt_t *p;
  int i;
  int iVar1;
  int iDiv;
  int fBase_local;
  int fSingleCube_local;
  int fUpdate_local;
  Fxch_Man_t *pFxchMan_local;
  
  i = Hsh_VecManAdd(pFxchMan->pDivHash,pFxchMan->vCubeFree);
  iVar1 = Vec_FltSize(pFxchMan->vDivWeights);
  if (iVar1 <= i) {
    __assert_fail("iDiv < Vec_FltSize( pFxchMan->vDivWeights )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchDiv.c"
                  ,0x12a,"int Fxch_DivRemove(Fxch_Man_t *, int, int, int)");
  }
  if (fSingleCube == 0) {
    p = pFxchMan->vDivWeights;
    iVar1 = Vec_IntSize(pFxchMan->vCubeFree);
    Vec_FltAddToEntry(p,i,(float)-(fBase + iVar1 + -1));
  }
  else {
    Vec_FltAddToEntry(pFxchMan->vDivWeights,i,-1.0);
  }
  if (((fUpdate != 0) && (pFxchMan->vDivPrio != (Vec_Que_t *)0x0)) &&
     (iVar1 = Vec_QueIsMember(pFxchMan->vDivPrio,i), iVar1 != 0)) {
    Vec_QueUpdate(pFxchMan->vDivPrio,i);
  }
  return i;
}

Assistant:

int Fxch_DivRemove( Fxch_Man_t* pFxchMan,
                    int fUpdate,
                    int fSingleCube,
                    int fBase )
{
    int iDiv = Hsh_VecManAdd( pFxchMan->pDivHash, pFxchMan->vCubeFree );

    assert( iDiv < Vec_FltSize( pFxchMan->vDivWeights ) );

    /* Decrement weight */
    if ( fSingleCube )
        Vec_FltAddToEntry( pFxchMan->vDivWeights, iDiv, -1 );
    else
        Vec_FltAddToEntry( pFxchMan->vDivWeights, iDiv, -( fBase + Vec_IntSize( pFxchMan->vCubeFree ) - 1 ) );

    if ( fUpdate )
        if ( pFxchMan->vDivPrio )
        {
            if ( Vec_QueIsMember( pFxchMan->vDivPrio, iDiv ) )
                Vec_QueUpdate( pFxchMan->vDivPrio, iDiv );
        }

    return iDiv;
}